

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

ssize_t __thiscall
fmt::v6::detail::arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::detail::error_handler>::
write(arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::detail::error_handler> *this,int __fd
     ,void *__buf,size_t __n)

{
  basic_string_view<char> s;
  format_error *this_00;
  ssize_t extraout_RAX;
  ssize_t sVar1;
  undefined4 in_register_00000034;
  char_type *__s;
  undefined1 local_40 [8];
  basic_string_view<char> sv;
  size_t length;
  char_type *value_local;
  arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::detail::error_handler> *this_local;
  
  __s = (char_type *)CONCAT44(in_register_00000034,__fd);
  if (__s == (char_type *)0x0) {
    this_00 = (format_error *)__cxa_allocate_exception(0x10);
    format_error::format_error(this_00,"string pointer is null");
    __cxa_throw(this_00,&format_error::typeinfo,format_error::~format_error);
  }
  sv.size_ = std::char_traits<char>::length(__s);
  basic_string_view<char>::basic_string_view((basic_string_view<char> *)local_40,__s,sv.size_);
  if (this->specs_ == (format_specs *)0x0) {
    sVar1 = write(this,local_40._0_4_,sv.data_,__n);
  }
  else {
    s.size_ = (size_t)sv.data_;
    s.data_ = (char *)local_40;
    write<char>(this,s,this->specs_);
    sVar1 = extraout_RAX;
  }
  return sVar1;
}

Assistant:

void write(const char_type* value) {
    if (!value) {
      FMT_THROW(format_error("string pointer is null"));
    } else {
      auto length = std::char_traits<char_type>::length(value);
      basic_string_view<char_type> sv(value, length);
      specs_ ? write(sv, *specs_) : write(sv);
    }
  }